

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall Test_aistr_compare_Test::TestBody(Test_aistr_compare_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_40;
  AssertHelper local_38;
  AssertionResult gtest_ar;
  char buf [10];
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::compare<10ul>(&buf,(char *)0x0);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x56,
             "Expected: ai::compare(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  ai::assign<10ul>(&buf,"1234");
  local_40.data_._0_4_ = ai::compare<10ul>(&buf,"1234");
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ai::compare(buf, \"1234\")","0",(int *)&local_40,
             (int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_40.data_._0_4_ = ai::compare<10ul>(&buf,"1234 ");
    local_38.data_._0_4_ = 0;
    testing::internal::CmpHelperNE<int,int>
              ((internal *)&gtest_ar,"ai::compare(buf, \"1234 \")","0",(int *)&local_40,
               (int *)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x5a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_40.data_._0_4_ = ai::compare<10ul>(&buf," 1234");
      local_38.data_._0_4_ = 0;
      testing::internal::CmpHelperNE<int,int>
                ((internal *)&gtest_ar,"ai::compare(buf, \" 1234\")","0",(int *)&local_40,
                 (int *)&local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x5b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_40.data_._0_4_ = ai::compare<10ul>(&buf,"1234");
        local_38.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"ai::compare(buf, \"1234\\0\")","0",(int *)&local_40,
                   (int *)&local_38);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_40);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x5c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          pcVar2 = "";
          ai::assign<10ul>(&buf,"");
          local_40.data_._0_4_ = ai::compare<10ul>(&buf,"");
          local_38.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"ai::compare(buf, \"\")","0",(int *)&local_40,
                     (int *)&local_38);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_40);
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x5f,pcVar2);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            ai::assign<10ul>(&buf,"123456789");
            local_40.data_._0_4_ = ai::compare<10ul>(&buf,"123456789");
            local_38.data_._0_4_ = 0;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"ai::compare(buf, \"123456789\")","0",(int *)&local_40,
                       (int *)&local_38);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              ai::assign<10ul>(&buf,"12345678901");
              local_40.data_._0_4_ = ai::compare<10ul>(&buf,"123456789");
              local_38.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"ai::compare(buf, \"123456789\")","0",
                         (int *)&local_40,(int *)&local_38);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_40);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                           ,0x65,pcVar2);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_40);
              }
              goto LAB_0010e0a7;
            }
            testing::Message::Message((Message *)&local_40);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x62,pcVar2);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_40);
LAB_0010e0a7:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Test_aistr, compare) {
    char buf[10] = {0};

    EXPECT_THROW(ai::compare(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);
    ASSERT_NE(ai::compare(buf, "1234 "), 0);
    ASSERT_NE(ai::compare(buf, " 1234"), 0);
    ASSERT_EQ(ai::compare(buf, "1234\0"), 0);

    ai::assign(buf, "");
    ASSERT_EQ(ai::compare(buf, ""), 0);

    ai::assign(buf, "123456789");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::assign(buf, "12345678901");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}